

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprMightBeIndexed(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int op)

{
  u8 uVar1;
  int iVar2;
  long lVar3;
  Index *pIVar4;
  
  uVar1 = pExpr->op;
  if (op - 0x37U < 4 && uVar1 == 0xb1) {
    pExpr = ((pExpr->x).pList)->a[0].pExpr;
    uVar1 = pExpr->op;
  }
  if (uVar1 == 0xa8) {
    *aiCurCol = pExpr->iTable;
    aiCurCol[1] = (int)pExpr->iColumn;
    return 1;
  }
  if (0 < (long)pFrom->nSrc) {
    lVar3 = 0;
    do {
      for (pIVar4 = (pFrom->a[lVar3].pSTab)->pIndex; pIVar4 != (Index *)0x0; pIVar4 = pIVar4->pNext)
      {
        if (pIVar4->aColExpr != (ExprList *)0x0) {
          iVar2 = exprMightBeIndexed2(pFrom,aiCurCol,pExpr,(int)lVar3);
          return iVar2;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != pFrom->nSrc);
  }
  return 0;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  int i;

  /* If this expression is a vector to the left or right of a
  ** inequality constraint (>, <, >= or <=), perform the processing
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    assert( ExprUseXList(pExpr) );
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }

  for(i=0; i<pFrom->nSrc; i++){
    Index *pIdx;
    for(pIdx=pFrom->a[i].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr ){
        return exprMightBeIndexed2(pFrom,aiCurCol,pExpr,i);
      }
    }
  }
  return 0;
}